

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BamStandardIndex_p.cpp
# Opt level: O2

void __thiscall
BamTools::Internal::BamStandardIndex::WriteAlignmentChunk
          (BamStandardIndex *this,BaiAlignmentChunk *chunk)

{
  IBamIODevice *pIVar1;
  int iVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  BamException *this_00;
  allocator local_6a;
  allocator local_69;
  uint64_t stop;
  uint64_t start;
  string local_58;
  string local_38;
  
  start = chunk->Start;
  stop = chunk->Stop;
  if (this->m_isBigEndian == true) {
    start = start >> 0x38 | (start & 0xff000000000000) >> 0x28 | (start & 0xff0000000000) >> 0x18 |
            (start & 0xff00000000) >> 8 | (start & 0xff000000) << 8 | (start & 0xff0000) << 0x18 |
            (start & 0xff00) << 0x28 | start << 0x38;
    stop = stop >> 0x38 | (stop & 0xff000000000000) >> 0x28 | (stop & 0xff0000000000) >> 0x18 |
           (stop & 0xff00000000) >> 8 | (stop & 0xff000000) << 8 | (stop & 0xff0000) << 0x18 |
           (stop & 0xff00) << 0x28 | stop << 0x38;
  }
  pIVar1 = (this->m_resources).Device;
  iVar2 = (*pIVar1->_vptr_IBamIODevice[8])(pIVar1,&start,8);
  pIVar1 = (this->m_resources).Device;
  iVar3 = (*pIVar1->_vptr_IBamIODevice[8])(pIVar1,&stop,8);
  if (CONCAT44(extraout_var_00,iVar3) + CONCAT44(extraout_var,iVar2) == 0x10) {
    return;
  }
  this_00 = (BamException *)__cxa_allocate_exception(0x28);
  std::__cxx11::string::string
            ((string *)&local_38,"BamStandardIndex::WriteAlignmentChunk",&local_69);
  std::__cxx11::string::string((string *)&local_58,"could not write BAI alignment chunk",&local_6a);
  BamException::BamException(this_00,&local_38,&local_58);
  __cxa_throw(this_00,&BamException::typeinfo,BamException::~BamException);
}

Assistant:

void BamStandardIndex::WriteAlignmentChunk(const BaiAlignmentChunk& chunk)
{

    // localize alignment chunk offsets
    uint64_t start = chunk.Start;
    uint64_t stop = chunk.Stop;

    // swap endian-ness if necessary
    if (m_isBigEndian) {
        SwapEndian_64(start);
        SwapEndian_64(stop);
    }

    // write to index file
    int64_t numBytesWritten = 0;
    numBytesWritten += m_resources.Device->Write((const char*)&start, sizeof(start));
    numBytesWritten += m_resources.Device->Write((const char*)&stop, sizeof(stop));
    if (numBytesWritten != (sizeof(start) + sizeof(stop)))
        throw BamException("BamStandardIndex::WriteAlignmentChunk",
                           "could not write BAI alignment chunk");
}